

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O2

string * __thiscall
absl::flags_internal::Unparse_abi_cxx11_
          (string *__return_storage_ptr__,flags_internal *this,unsigned_short v)

{
  undefined2 extraout_DX;
  undefined6 extraout_var;
  AlphaNum local_40;
  
  AlphaNum::AlphaNum(&local_40,(int)this);
  StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&local_40,
                    (AlphaNum *)CONCAT62(extraout_var,extraout_DX));
  return __return_storage_ptr__;
}

Assistant:

std::string Unparse(unsigned short v) { return absl::StrCat(v); }